

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O0

cmArgumentParser<void> * __thiscall
cmArgumentParser<void>::BindParsedKeywords
          (cmArgumentParser<void> *this,
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *ref)

{
  anon_class_8_1_ba1d73f3 local_40;
  KeywordNameAction local_38;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *local_18;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *ref_local;
  cmArgumentParser<void> *this_local;
  
  local_40.ref = ref;
  local_18 = ref;
  ref_local = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)this;
  std::function<void(ArgumentParser::Instance&,std::basic_string_view<char,std::char_traits<char>>)>
  ::
  function<cmArgumentParser<void>::BindParsedKeywords(std::vector<std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>&)::_lambda(ArgumentParser::Instance&,std::basic_string_view<char,std::char_traits<char>>)_1_,void>
            ((function<void(ArgumentParser::Instance&,std::basic_string_view<char,std::char_traits<char>>)>
              *)&local_38,&local_40);
  ArgumentParser::Base::BindParsedKeyword(&this->super_Base,&local_38);
  std::
  function<void_(ArgumentParser::Instance_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::~function(&local_38);
  return this;
}

Assistant:

cmArgumentParser& BindParsedKeywords(std::vector<cm::string_view>& ref)
  {
    this->Base::BindParsedKeyword(
      [&ref](Instance&, cm::string_view arg) { ref.emplace_back(arg); });
    return *this;
  }